

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_set_size_dependent_vars(AV1_COMP *cpi,int *q,int *bottom_index,int *top_index)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  AV1_COMP *in_RDI;
  int arf_q;
  int this_height;
  double qstep_ratio;
  double qratio_grad;
  int tpl_q;
  RateControlCfg *rc_cfg;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  undefined8 in_stack_ffffffffffffffa0;
  aom_bit_depth_t bit_depth;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  AV1_COMP *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  aom_bit_depth_t in_stack_ffffffffffffffc4;
  RateControlCfg *in_stack_ffffffffffffffc8;
  AV1_COMP *cpi_00;
  
  bit_depth = (aom_bit_depth_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  av1_set_speed_features_framesize_dependent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  cpi_00 = (AV1_COMP *)&in_RDI->ppi->gf_group;
  if ((((in_RDI->oxcf).algo_cfg.enable_tpl_model & 1U) != 0) &&
     (iVar1 = av1_tpl_stats_ready(&in_RDI->ppi->tpl_data,(uint)in_RDI->gf_frame_index), iVar1 != 0))
  {
    process_tpl_stats_frame((AV1_COMP *)rc_cfg);
    av1_tpl_rdmult_setup((AV1_COMP *)rc_cfg);
  }
  iVar1 = av1_rc_pick_q_and_bounds
                    (cpi_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                     in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
  *in_RSI = iVar1;
  if (((in_RDI->oxcf).rc_cfg.mode == AOM_CBR) && ((in_RDI->rc).force_max_q != 0)) {
    *in_RSI = (in_RDI->rc).worst_quality;
    (in_RDI->rc).force_max_q = 0;
  }
  if ((((in_RDI->oxcf).rc_cfg.mode == AOM_Q) &&
      ((in_RDI->ppi->tpl_data).tpl_frame[in_RDI->gf_frame_index].is_valid != '\0')) &&
     (iVar1 = is_lossless_requested(&(in_RDI->oxcf).rc_cfg), iVar1 == 0)) {
    in_stack_ffffffffffffffc8 = &(in_RDI->oxcf).rc_cfg;
    in_stack_ffffffffffffffc4 =
         av1_tpl_get_q_index((TplParams *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8,bit_depth);
    iVar1 = clamp(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc8->best_allowed_q,
                  in_stack_ffffffffffffffc8->worst_allowed_q);
    *in_RSI = iVar1;
    iVar1 = *in_RSI;
    *in_RDX = iVar1;
    *in_RCX = iVar1;
    if (*(char *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                 (ulong)in_RDI->gf_frame_index) == '\x03') {
      (in_RDI->ppi->p_rc).arf_q = *in_RSI;
    }
  }
  if (((in_RDI->oxcf).q_cfg.use_fixed_qp_offsets != 0) && ((in_RDI->oxcf).rc_cfg.mode == AOM_Q)) {
    iVar1 = is_frame_tpl_eligible((GF_GROUP *)cpi_00,in_RDI->gf_frame_index);
    if (iVar1 == 0) {
      if (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x2e] +
                  (ulong)in_RDI->gf_frame_index * 2) <
          *(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xab]) {
        iVar2 = (in_RDI->ppi->p_rc).arf_q;
        for (iVar1 = *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x2e] +
                             (ulong)in_RDI->gf_frame_index * 2); 1 < iVar1; iVar1 = iVar1 + -1) {
          iVar2 = (iVar2 + (in_RDI->oxcf).rc_cfg.cq_level + 1) / 2;
        }
        *in_RSI = iVar2;
        *in_RDX = iVar2;
        *in_RCX = iVar2;
      }
    }
    else {
      iVar1 = av1_get_q_index_from_qstep_ratio
                        ((int)((ulong)cpi_00 >> 0x20),(double)in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc4);
      *in_RSI = iVar1;
      iVar1 = *in_RSI;
      *in_RDX = iVar1;
      *in_RCX = iVar1;
      if (((*(char *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                     (ulong)in_RDI->gf_frame_index) == '\x03') ||
          (*(char *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                    (ulong)in_RDI->gf_frame_index) == '\0')) ||
         (*(char *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                   (ulong)in_RDI->gf_frame_index) == '\x02')) {
        (in_RDI->ppi->p_rc).arf_q = *in_RSI;
      }
    }
  }
  iVar1 = is_stat_consumption_stage_twopass(in_RDI);
  if ((iVar1 != 0) && ((in_RDI->sf).hl_sf.static_segmentation != 0)) {
    configure_static_seg_features
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void av1_set_size_dependent_vars(AV1_COMP *cpi, int *q, int *bottom_index,
                                 int *top_index) {
  AV1_COMMON *const cm = &cpi->common;

  // Setup variables that depend on the dimensions of the frame.
  av1_set_speed_features_framesize_dependent(cpi, cpi->speed);

#if !CONFIG_REALTIME_ONLY
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (cpi->oxcf.algo_cfg.enable_tpl_model &&
      av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    process_tpl_stats_frame(cpi);
    av1_tpl_rdmult_setup(cpi);
  }
#endif

  // Decide q and q bounds.
  *q = av1_rc_pick_q_and_bounds(cpi, cm->width, cm->height, cpi->gf_frame_index,
                                bottom_index, top_index);

  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && cpi->rc.force_max_q) {
    *q = cpi->rc.worst_quality;
    cpi->rc.force_max_q = 0;
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.rc_cfg.mode == AOM_Q &&
      cpi->ppi->tpl_data.tpl_frame[cpi->gf_frame_index].is_valid &&
      !is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
    const int tpl_q = av1_tpl_get_q_index(
        &cpi->ppi->tpl_data, cpi->gf_frame_index, cpi->rc.active_worst_quality,
        cm->seq_params->bit_depth);
    *q = clamp(tpl_q, rc_cfg->best_allowed_q, rc_cfg->worst_allowed_q);
    *top_index = *bottom_index = *q;
    if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE)
      cpi->ppi->p_rc.arf_q = *q;
  }

  if (cpi->oxcf.q_cfg.use_fixed_qp_offsets && cpi->oxcf.rc_cfg.mode == AOM_Q) {
    if (is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
      const double qratio_grad =
          cpi->ppi->p_rc.baseline_gf_interval > 20 ? 0.2 : 0.3;
      const double qstep_ratio =
          0.2 +
          (1.0 - (double)cpi->rc.active_worst_quality / MAXQ) * qratio_grad;
      *q = av1_get_q_index_from_qstep_ratio(
          cpi->rc.active_worst_quality, qstep_ratio, cm->seq_params->bit_depth);
      *top_index = *bottom_index = *q;
      if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == GF_UPDATE)
        cpi->ppi->p_rc.arf_q = *q;
    } else if (gf_group->layer_depth[cpi->gf_frame_index] <
               gf_group->max_layer_depth) {
      int this_height = gf_group->layer_depth[cpi->gf_frame_index];
      int arf_q = cpi->ppi->p_rc.arf_q;
      while (this_height > 1) {
        arf_q = (arf_q + cpi->oxcf.rc_cfg.cq_level + 1) / 2;
        --this_height;
      }
      *top_index = *bottom_index = *q = arf_q;
    }
  }
#endif

  // Configure experimental use of segmentation for enhanced coding of
  // static regions if indicated.
  // Only allowed in the second pass of a two pass encode, as it requires
  // lagged coding, and if the relevant speed feature flag is set.
  if (is_stat_consumption_stage_twopass(cpi) &&
      cpi->sf.hl_sf.static_segmentation)
    configure_static_seg_features(cpi);
}